

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dauDsd.c
# Opt level: O0

int Dau_DsdDecomposeLevel
              (word *pTruth,int nVarsInit,int fSplitPrime,int fWriteTruth,char *pRes,int *pVarLevels
              )

{
  int iVar1;
  int *pMatches;
  int Status;
  Dau_Dsd_t *p;
  Dau_Dsd_t P;
  int *pVarLevels_local;
  char *pRes_local;
  int fWriteTruth_local;
  int fSplitPrime_local;
  int nVarsInit_local;
  word *pTruth_local;
  
  P.nVarsUsed = 0;
  P.pOutput._1992_8_ = pVarLevels;
  P.nConsts = fSplitPrime;
  P.uConstMask = fWriteTruth;
  P._24_8_ = pVarLevels;
  if ((*pTruth & 1) == 0) {
    iVar1 = Abc_TtWordNum(nVarsInit);
    iVar1 = Abc_TtIsConst0(pTruth,iVar1);
    if (iVar1 != 0) {
      if (pRes == (char *)0x0) {
        return P.nVarsUsed;
      }
      *pRes = '0';
      pRes[1] = '\0';
      return P.nVarsUsed;
    }
  }
  if ((*pTruth & 1) != 0) {
    iVar1 = Abc_TtWordNum(nVarsInit);
    iVar1 = Abc_TtIsConst1(pTruth,iVar1);
    if (iVar1 != 0) {
      if (pRes == (char *)0x0) {
        return P.nVarsUsed;
      }
      *pRes = '1';
      pRes[1] = '\0';
      return P.nVarsUsed;
    }
  }
  iVar1 = Dau_DsdDecomposeInt((Dau_Dsd_t *)&p,pTruth,nVarsInit);
  pMatches = Dau_DsdComputeMatches(P.Cache[0x1f] + 0x18);
  Dau_DsdRemoveBraces(P.Cache[0x1f] + 0x18,pMatches);
  if (pRes != (char *)0x0) {
    strcpy(pRes,P.Cache[0x1f] + 0x18);
  }
  if ((fSplitPrime == 0) && (iVar1 == 1)) {
    __assert_fail("fSplitPrime || Status != 1",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/opt/dau/dauDsd.c"
                  ,0x7a1,"int Dau_DsdDecomposeLevel(word *, int, int, int, char *, int *)");
  }
  if ((fSplitPrime != 0) && (iVar1 == 2)) {
    return -1;
  }
  return P.nVarsUsed;
}

Assistant:

int Dau_DsdDecomposeLevel( word * pTruth, int nVarsInit, int fSplitPrime, int fWriteTruth, char * pRes, int * pVarLevels )
{
    Dau_Dsd_t P, * p = &P;
    p->fSplitPrime = fSplitPrime;
    p->fWriteTruth = fWriteTruth;
    p->pVarLevels  = pVarLevels;
    p->nSizeNonDec = 0;
    if ( (pTruth[0] & 1) == 0 && Abc_TtIsConst0(pTruth, Abc_TtWordNum(nVarsInit)) )
        { if ( pRes ) pRes[0] = '0', pRes[1] = 0; }
    else if ( (pTruth[0] & 1) && Abc_TtIsConst1(pTruth, Abc_TtWordNum(nVarsInit)) )
        { if ( pRes ) pRes[0] = '1', pRes[1] = 0; }
    else 
    {
        int Status = Dau_DsdDecomposeInt( p, pTruth, nVarsInit );
        Dau_DsdRemoveBraces( p->pOutput, Dau_DsdComputeMatches(p->pOutput) );
        if ( pRes )
            strcpy( pRes, p->pOutput );
        assert( fSplitPrime || Status != 1 );
        if ( fSplitPrime && Status == 2 )
            return -1;
    }
//    assert( p->nSizeNonDec == 0 );
    return p->nSizeNonDec;
}